

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_address.cpp
# Opt level: O3

int CfdGetPeginAddress(void *handle,int mainchain_network_type,char *fedpeg_script,int hash_type,
                      char *pubkey,char *redeem_script,char **pegin_address,char **claim_script,
                      char **tweaked_fedpeg_script)

{
  pointer *ppuVar1;
  Script *pSVar2;
  bool bVar3;
  NetType mainchain_net_type;
  AddressType address_type;
  size_t sVar4;
  pointer pSVar5;
  pointer pSVar6;
  char *pcVar7;
  CfdException *pCVar8;
  char *work_script;
  char *work_address;
  Script tweak_fedpegscript;
  Address addr;
  Script claim_script_obj;
  allocator local_25a;
  bool local_259;
  Script local_258;
  Script local_220;
  undefined8 local_1e8;
  undefined1 local_1e0 [32];
  char local_1c0 [16];
  pointer local_1b0;
  pointer local_198;
  pointer local_180;
  TapBranch local_168;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_f0;
  Script local_d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  Script local_68;
  
  local_258.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8 = 0;
  local_258.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)handle;
  cfd::Initialize();
  if (pegin_address == (char **)0x0) {
    local_1e0._0_8_ = "cfdcapi_elements_address.cpp";
    local_1e0._8_4_ = 0xaa;
    local_1e0._16_8_ = "CfdGetPeginAddress";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_1e0,kCfdLogLevelWarning,"pegin_address is null.");
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1e0._0_8_ = local_1e0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e0,"Failed to parameter. pegin_address is null.","");
    cfd::core::CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_1e0);
    __cxa_throw(pCVar8,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (pubkey == (char *)0x0 && redeem_script == (char *)0x0) {
    local_1e0._0_8_ = "cfdcapi_elements_address.cpp";
    local_1e0._8_4_ = 0xb0;
    local_1e0._16_8_ = "CfdGetPeginAddress";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_1e0,kCfdLogLevelWarning,"pubkey and script is null.");
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1e0._0_8_ = local_1e0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e0,"Failed to parameter. pubkey and script is null.","");
    cfd::core::CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_1e0);
    __cxa_throw(pCVar8,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (claim_script == (char **)0x0) {
    local_1e0._0_8_ = "cfdcapi_elements_address.cpp";
    local_1e0._8_4_ = 0xb6;
    local_1e0._16_8_ = "CfdGetPeginAddress";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_1e0,kCfdLogLevelWarning,"claim_script is null.");
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1e0._0_8_ = local_1e0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e0,"Failed to parameter. claim_script is null.","");
    cfd::core::CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_1e0);
    __cxa_throw(pCVar8,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar3 = cfd::capi::IsEmptyString(fedpeg_script);
  if (bVar3) {
    local_1e0._0_8_ = "cfdcapi_elements_address.cpp";
    local_1e0._8_4_ = 0xbc;
    local_1e0._16_8_ = "CfdGetPeginAddress";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_1e0,kCfdLogLevelWarning,"fedpeg_script is null or empty.")
    ;
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1e0._0_8_ = local_1e0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e0,"Failed to parameter. fedpeg_script is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_1e0);
    __cxa_throw(pCVar8,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_259 = false;
  mainchain_net_type = cfd::capi::ConvertNetType(mainchain_network_type,&local_259);
  if (local_259 == false) {
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1e0._0_8_ = local_1e0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e0,"Invalid network type. need mainchain network type.","");
    cfd::core::CfdException::CfdException(pCVar8,kCfdIllegalStateError,(string *)local_1e0);
    __cxa_throw(pCVar8,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  address_type = cfd::capi::ConvertHashToAddressType(0);
  cfd::core::Script::Script(&local_68);
  if (pubkey != (char *)0x0) {
    local_1e0._0_8_ = local_1e0 + 0x10;
    sVar4 = strlen(pubkey);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,pubkey,pubkey + sVar4);
    cfd::core::ByteData::ByteData((ByteData *)&local_220,(string *)local_1e0);
    bVar3 = cfd::core::Pubkey::IsValid((ByteData *)&local_220);
    if (local_220._vptr_Script != (_func_int **)0x0) {
      operator_delete(local_220._vptr_Script);
    }
    if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
      operator_delete((void *)local_1e0._0_8_);
    }
    if (bVar3) {
      std::__cxx11::string::string((string *)&local_220,pubkey,&local_25a);
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_258,(string *)&local_220);
      cfd::core::ScriptUtil::CreateP2wpkhLockingScript((Script *)local_1e0,(Pubkey *)&local_258);
      cfd::core::Script::operator=(&local_68,(Script *)local_1e0);
      cfd::core::Script::~Script((Script *)local_1e0);
      if (local_258._vptr_Script != (_func_int **)0x0) {
        operator_delete(local_258._vptr_Script);
      }
      pSVar2 = &local_220;
      goto LAB_003e7e61;
    }
  }
  std::__cxx11::string::string((string *)&local_258,redeem_script,&local_25a);
  cfd::core::Script::Script(&local_220,(string *)&local_258);
  cfd::core::ScriptUtil::CreateP2wshLockingScript((Script *)local_1e0,&local_220);
  cfd::core::Script::operator=(&local_68,(Script *)local_1e0);
  cfd::core::Script::~Script((Script *)local_1e0);
  cfd::core::Script::~Script(&local_220);
  pSVar2 = &local_258;
LAB_003e7e61:
  if (pSVar2->_vptr_Script !=
      (_func_int **)
      ((long)&(pSVar2->script_data_).data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8U)) {
    operator_delete(pSVar2->_vptr_Script);
  }
  std::__cxx11::string::string((string *)&local_258,fedpeg_script,&local_25a);
  cfd::core::Script::Script((Script *)local_1e0,(string *)&local_258);
  cfd::core::ContractHashUtil::GetContractScript(&local_220,&local_68,(Script *)local_1e0);
  cfd::core::Script::~Script((Script *)local_1e0);
  ppuVar1 = (pointer *)((long)&local_258.script_data_.data_ + 8);
  if (local_258._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_258._vptr_Script);
  }
  cfd::ElementsAddressFactory::CreatePegInAddress
            ((Address *)local_1e0,mainchain_net_type,address_type,&local_220);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&local_258,(Address *)local_1e0);
  pSVar5 = (pointer)cfd::capi::CreateString((string *)&local_258);
  local_258.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pSVar5;
  if (local_258._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_258._vptr_Script);
  }
  cfd::core::Script::GetHex_abi_cxx11_((string *)&local_258,&local_68);
  pSVar6 = (pointer)cfd::capi::CreateString((string *)&local_258);
  local_258.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_finish = pSVar6;
  if (local_258._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_258._vptr_Script);
  }
  if (tweaked_fedpeg_script == (char **)0x0) {
    *pegin_address = (char *)pSVar5;
    *claim_script = (char *)pSVar6;
  }
  else {
    cfd::core::Script::GetHex_abi_cxx11_((string *)&local_258,&local_220);
    pcVar7 = cfd::capi::CreateString((string *)&local_258);
    if (local_258._vptr_Script != (_func_int **)ppuVar1) {
      operator_delete(local_258._vptr_Script);
    }
    *pegin_address = (char *)pSVar5;
    *claim_script = (char *)pSVar6;
    *tweaked_fedpeg_script = pcVar7;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_98);
  cfd::core::Script::~Script(&local_d8);
  local_168._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_f0);
  cfd::core::TapBranch::~TapBranch(&local_168);
  if (local_180 != (pointer)0x0) {
    operator_delete(local_180);
  }
  if (local_198 != (pointer)0x0) {
    operator_delete(local_198);
  }
  if (local_1b0 != (pointer)0x0) {
    operator_delete(local_1b0);
  }
  if ((char *)local_1e0._16_8_ != local_1c0) {
    operator_delete((void *)local_1e0._16_8_);
  }
  cfd::core::Script::~Script(&local_220);
  cfd::core::Script::~Script(&local_68);
  return 0;
}

Assistant:

int CfdGetPeginAddress(
    void* handle, int mainchain_network_type, const char* fedpeg_script,
    int hash_type, const char* pubkey, const char* redeem_script,
    char** pegin_address, char** claim_script, char** tweaked_fedpeg_script) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_address = nullptr;
  char* work_script = nullptr;
  char* work_fedpeg_script = nullptr;
  try {
    cfd::Initialize();
    if (pegin_address == nullptr) {
      warn(CFD_LOG_SOURCE, "pegin_address is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pegin_address is null.");
    }
    if ((pubkey == nullptr) && (redeem_script == nullptr)) {
      warn(CFD_LOG_SOURCE, "pubkey and script is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey and script is null.");
    }
    if (claim_script == nullptr) {
      warn(CFD_LOG_SOURCE, "claim_script is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. claim_script is null.");
    }
    if (IsEmptyString(fedpeg_script)) {
      warn(CFD_LOG_SOURCE, "fedpeg_script is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. fedpeg_script is null or empty.");
    }

    bool is_bitcoin = false;
    auto net_type = ConvertNetType(mainchain_network_type, &is_bitcoin);
    if (!is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid network type. need mainchain network type.");
    }
    auto addr_type = ConvertHashToAddressType(hash_type);
    Script claim_script_obj;
    if ((pubkey != nullptr) && Pubkey::IsValid(ByteData(pubkey))) {
      claim_script_obj = ScriptUtil::CreateP2wpkhLockingScript(Pubkey(pubkey));
    } else {
      claim_script_obj =
          ScriptUtil::CreateP2wshLockingScript(Script(redeem_script));
    }

    Script tweak_fedpegscript = ContractHashUtil::GetContractScript(
        claim_script_obj, Script(fedpeg_script));
    auto addr = ElementsAddressFactory::CreatePegInAddress(
        net_type, addr_type, tweak_fedpegscript);

    work_address = CreateString(addr.GetAddress());
    work_script = CreateString(claim_script_obj.GetHex());
    if (tweaked_fedpeg_script != nullptr) {
      work_fedpeg_script = CreateString(tweak_fedpegscript.GetHex());
    }

    *pegin_address = work_address;
    *claim_script = work_script;
    if (tweaked_fedpeg_script != nullptr) {
      *tweaked_fedpeg_script = work_fedpeg_script;
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_address, &work_script, &work_fedpeg_script);
  return result;
}